

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

int __thiscall
kj::ArrayBuilder<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry>::
truncate(ArrayBuilder<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry>
         *this,char *__file,__off_t __length)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  lVar1 = *(long *)this;
  uVar6 = *(ulong *)(this + 8);
  while (uVar5 = uVar6, (ulong)((long)__file * 0x28 + lVar1) < uVar5) {
    *(ulong *)(this + 8) = uVar5 - 0x28;
    lVar2 = *(long *)(uVar5 - 0x20);
    uVar6 = uVar5 - 0x28;
    if (lVar2 != 0) {
      lVar3 = *(long *)(uVar5 - 0x18);
      lVar4 = *(long *)(uVar5 - 0x10);
      *(undefined8 *)(uVar5 - 0x20) = 0;
      *(undefined8 *)(uVar5 - 0x18) = 0;
      *(undefined8 *)(uVar5 - 0x10) = 0;
      (**(code **)**(undefined8 **)(uVar5 - 8))
                (*(undefined8 **)(uVar5 - 8),lVar2,8,lVar3 - lVar2 >> 3,lVar4 - lVar2 >> 3,0);
      uVar6 = *(ulong *)(this + 8);
    }
  }
  return (int)uVar5;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(target);
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }